

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_UnknownExtendee_Test::
AllowUnknownDependenciesTest_UnknownExtendee_Test
          (AllowUnknownDependenciesTest_UnknownExtendee_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AllowUnknownDependenciesTest_01884158;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .
  super_WithParamInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_01884198;
  SimpleDescriptorDatabase::SimpleDescriptorDatabase
            (&(this->super_AllowUnknownDependenciesTest).db_);
  (this->super_AllowUnknownDependenciesTest).pool_._M_t.
  super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>._M_head_impl =
       (DescriptorPool *)0x0;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AllowUnknownDependenciesTest_01879238;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .
  super_WithParamInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__AllowUnknownDependenciesTest_UnknownExtendee_Test_01879278;
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, UnknownExtendee) {
  // Test that we can extend an unknown type.  This is slightly tricky because
  // it means that the placeholder type must have an extension range.

  FileDescriptorProto extension_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: 'extension.proto'"
      "extension { extendee: 'UnknownType' name:'some_extension' number:123"
      "            label:LABEL_OPTIONAL type:TYPE_INT32 }",
      &extension_proto));
  const FileDescriptor* file = BuildFile(extension_proto);

  ASSERT_TRUE(file != nullptr);

  ASSERT_EQ(1, file->extension_count());
  const Descriptor* extendee = file->extension(0)->containing_type();
  EXPECT_EQ("UnknownType", extendee->name());
  EXPECT_TRUE(extendee->is_placeholder());
  ASSERT_EQ(1, extendee->extension_range_count());
  EXPECT_EQ(1, extendee->extension_range(0)->start_number());
  EXPECT_EQ(FieldDescriptor::kMaxNumber + 1,
            extendee->extension_range(0)->end_number());
}